

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O1

CURLcode cf_tcp_connect(Curl_cfilter *cf,Curl_easy *data,_Bool blocking,_Bool *done)

{
  int error;
  uint uVar1;
  void *pvVar2;
  _Bool _Var3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  char *pcVar8;
  CURLcode CVar9;
  curltime cVar10;
  char buffer [256];
  char local_138 [264];
  
  if ((cf->field_0x24 & 1) != 0) {
    *done = true;
    return CURLE_OK;
  }
  if (blocking) {
    return CURLE_UNSUPPORTED_PROTOCOL;
  }
  pvVar2 = cf->ctx;
  *done = false;
  CVar9 = CURLE_COULDNT_CONNECT;
  if (*(int *)((long)pvVar2 + 0x98) == -1) {
    CVar9 = cf_socket_open(cf,data);
    iVar5 = 2;
    if (CVar9 == CURLE_OK) {
      if ((cf->field_0x24 & 1) == 0) {
        iVar6 = do_connect(cf,data,(_Bool)(SUB41(cf->conn->bits,3) & 1));
        piVar7 = __errno_location();
        error = *piVar7;
        set_local_ip(cf,data);
        if ((((data != (Curl_easy *)0x0) && (cf != (Curl_cfilter *)0x0)) &&
            ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0)) && (0 < cf->cft->log_level)) {
          Curl_trc_cf_infof(data,cf,"local address %s port %d...",(long)pvVar2 + 0x114,
                            (ulong)*(uint *)((long)pvVar2 + 0x144));
        }
        iVar5 = 0;
        CVar9 = CURLE_OK;
        if (iVar6 == -1) {
          CVar9 = socket_connect_result(data,(char *)((long)pvVar2 + 0xe0),error);
          iVar5 = 2;
        }
      }
      else {
        *done = true;
        CVar9 = CURLE_OK;
        iVar5 = 1;
      }
    }
    if (iVar5 != 2) {
      if (iVar5 != 0) {
        return CURLE_OK;
      }
      goto LAB_005fc3d0;
    }
LAB_005fc5f5:
    if (CVar9 != CURLE_OK) {
      if (*(int *)((long)pvVar2 + 0x178) != 0) {
        set_local_ip(cf,data);
        iVar5 = *(int *)((long)pvVar2 + 0x178);
        (data->state).os_errno = iVar5;
        piVar7 = __errno_location();
        *piVar7 = iVar5;
        if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
          uVar4 = *(uint *)((long)pvVar2 + 0x110);
          uVar1 = *(uint *)((long)pvVar2 + 0x144);
          pcVar8 = Curl_strerror(*(int *)((long)pvVar2 + 0x178),local_138,0x100);
          Curl_infof(data,"connect to %s port %u from %s port %d failed: %s",(long)pvVar2 + 0xe0,
                     (ulong)uVar4,(long)pvVar2 + 0x114,(ulong)uVar1,pcVar8);
        }
      }
      if (*(int *)((long)pvVar2 + 0x98) != -1) {
        socket_close(data,cf->conn,1,*(int *)((long)pvVar2 + 0x98));
        *(undefined4 *)((long)pvVar2 + 0x98) = 0xffffffff;
      }
      *done = false;
    }
  }
  else {
LAB_005fc3d0:
    uVar4 = Curl_socket_check(-1,-1,*(curl_socket_t *)((long)pvVar2 + 0x98),0);
    if (uVar4 == 2) {
LAB_005fc543:
      _Var3 = verifyconnect(*(curl_socket_t *)((long)pvVar2 + 0x98),(int *)((long)pvVar2 + 0x178));
      if (!_Var3) goto LAB_005fc5f5;
      cVar10 = Curl_now();
      *(time_t *)((long)pvVar2 + 0x158) = cVar10.tv_sec;
      *(int *)((long)pvVar2 + 0x160) = cVar10.tv_usec;
      set_local_ip(cf,data);
      *done = true;
      cf->field_0x24 = cf->field_0x24 | 1;
      if (data == (Curl_easy *)0x0) {
        return CURLE_OK;
      }
      if (cf == (Curl_cfilter *)0x0) {
        return CURLE_OK;
      }
      if ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) == 0) {
        return CURLE_OK;
      }
      if (cf->cft->log_level < 1) {
        return CURLE_OK;
      }
      pcVar8 = "connected";
    }
    else {
      if (uVar4 != 0) {
        if (((cf->conn->bits).field_0x3 & 1) == 0) {
          if ((uVar4 & 4) != 0) {
            verifyconnect(*(curl_socket_t *)((long)pvVar2 + 0x98),(int *)((long)pvVar2 + 0x178));
            CVar9 = CURLE_COULDNT_CONNECT;
          }
          goto LAB_005fc5f5;
        }
        goto LAB_005fc543;
      }
      if (data == (Curl_easy *)0x0) {
        return CURLE_OK;
      }
      if (cf == (Curl_cfilter *)0x0) {
        return CURLE_OK;
      }
      if ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) == 0) {
        return CURLE_OK;
      }
      if (cf->cft->log_level < 1) {
        return CURLE_OK;
      }
      pcVar8 = "not connected yet";
    }
    CVar9 = CURLE_OK;
    Curl_trc_cf_infof(data,cf,pcVar8);
  }
  return CVar9;
}

Assistant:

static CURLcode cf_tcp_connect(struct Curl_cfilter *cf,
                               struct Curl_easy *data,
                               bool blocking, bool *done)
{
  struct cf_socket_ctx *ctx = cf->ctx;
  CURLcode result = CURLE_COULDNT_CONNECT;
  int rc = 0;

  (void)data;
  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  /* TODO: need to support blocking connect? */
  if(blocking)
    return CURLE_UNSUPPORTED_PROTOCOL;

  *done = FALSE; /* a very negative world view is best */
  if(ctx->sock == CURL_SOCKET_BAD) {
    int error;

    result = cf_socket_open(cf, data);
    if(result)
      goto out;

    if(cf->connected) {
      *done = TRUE;
      return CURLE_OK;
    }

    /* Connect TCP socket */
    rc = do_connect(cf, data, cf->conn->bits.tcp_fastopen);
    error = SOCKERRNO;
    set_local_ip(cf, data);
    CURL_TRC_CF(data, cf, "local address %s port %d...",
                ctx->l_ip, ctx->l_port);
    if(-1 == rc) {
      result = socket_connect_result(data, ctx->r_ip, error);
      goto out;
    }
  }

#ifdef mpeix
  /* Call this function once now, and ignore the results. We do this to
     "clear" the error state on the socket so that we can later read it
     reliably. This is reported necessary on the MPE/iX operating
     system. */
  (void)verifyconnect(ctx->sock, NULL);
#endif
  /* check socket for connect */
  rc = SOCKET_WRITABLE(ctx->sock, 0);

  if(rc == 0) { /* no connection yet */
    CURL_TRC_CF(data, cf, "not connected yet");
    return CURLE_OK;
  }
  else if(rc == CURL_CSELECT_OUT || cf->conn->bits.tcp_fastopen) {
    if(verifyconnect(ctx->sock, &ctx->error)) {
      /* we are connected with TCP, awesome! */
      ctx->connected_at = Curl_now();
      set_local_ip(cf, data);
      *done = TRUE;
      cf->connected = TRUE;
      CURL_TRC_CF(data, cf, "connected");
      return CURLE_OK;
    }
  }
  else if(rc & CURL_CSELECT_ERR) {
    (void)verifyconnect(ctx->sock, &ctx->error);
    result = CURLE_COULDNT_CONNECT;
  }

out:
  if(result) {
    if(ctx->error) {
      set_local_ip(cf, data);
      data->state.os_errno = ctx->error;
      SET_SOCKERRNO(ctx->error);
#ifndef CURL_DISABLE_VERBOSE_STRINGS
      {
        char buffer[STRERROR_LEN];
        infof(data, "connect to %s port %u from %s port %d failed: %s",
              ctx->r_ip, ctx->r_port, ctx->l_ip, ctx->l_port,
              Curl_strerror(ctx->error, buffer, sizeof(buffer)));
      }
#endif
    }
    if(ctx->sock != CURL_SOCKET_BAD) {
      socket_close(data, cf->conn, TRUE, ctx->sock);
      ctx->sock = CURL_SOCKET_BAD;
    }
    *done = FALSE;
  }
  return result;
}